

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined4 *__s;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  short sVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  byte *pbVar18;
  int iVar19;
  int iVar20;
  HUF_CElt *pHVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 *puVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  size_t sVar34;
  int iVar35;
  ulong uVar36;
  HUF_CElt *elt;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  U16 nbPerRank [13];
  undefined8 local_b0;
  uint local_a8 [2];
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_68;
  undefined8 local_60;
  unkbyte10 Stack_58;
  undefined6 local_4e;
  unkbyte10 Stack_48;
  ulong local_38;
  
  local_38 = wkspSize;
  __s = (undefined4 *)HUF_alignUpWorkspace(workSpace,&local_38,4);
  sVar34 = 0xffffffffffffffbe;
  if ((0x12ff < local_38) && (sVar34 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar23 = (ulong)(maxSymbolValue + 1);
    uVar22 = 0;
    local_b0 = CTable;
    memset(__s,0,0x1300);
    pHVar21 = local_b0;
    do {
      uVar7 = count[uVar22];
      uVar32 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (uVar32 ^ 0xffffffe0) + 0xbe;
      if (uVar7 < 0xa5) {
        uVar32 = uVar7;
      }
      *(short *)(__s + (ulong)uVar32 + 0x400) = *(short *)(__s + (ulong)uVar32 + 0x400) + 1;
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
    uVar7 = 0xb;
    if (maxNbBits != 0) {
      uVar7 = maxNbBits;
    }
    if (*(short *)(__s + 0x4bf) != 0) {
      __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3d40,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    lVar8 = 0x4be;
    sVar11 = 0;
    do {
      sVar11 = sVar11 + *(short *)(__s + lVar8);
      *(short *)(__s + lVar8) = sVar11;
      *(short *)((long)__s + lVar8 * 4 + 2) = sVar11;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0x3ff);
    uVar22 = 0;
    do {
      uVar32 = count[uVar22];
      uVar26 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = (uVar26 ^ 0xffffffe0) + 0xbe;
      if (uVar32 < 0xa5) {
        uVar26 = uVar32;
      }
      uVar12 = *(ushort *)((long)__s + (ulong)uVar26 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar26 * 4 + 0x1006) = uVar12 + 1;
      if ((ushort)maxSymbolValue < uVar12) {
        __assert_fail("pos < maxSymbolValue1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3d4c,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)"
                     );
      }
      __s[(ulong)uVar12 * 2 + 2] = uVar32;
      *(char *)((long)__s + (ulong)uVar12 * 8 + 0xe) = (char)uVar22;
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
    lVar8 = 0x4a5;
    do {
      uVar12 = *(ushort *)(__s + lVar8);
      iVar19 = (uint)*(ushort *)((long)__s + lVar8 * 4 + 2) - (uint)uVar12;
      if (1 < iVar19) {
        if (maxSymbolValue < uVar12) {
          __assert_fail("bucketStartIdx < maxSymbolValue1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3d56,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)uVar12 * 2 + 2),0,iVar19 + -1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x4bf);
    if (maxSymbolValue != 0) {
      lVar8 = 0;
      uVar32 = __s[2];
      do {
        lVar29 = lVar8 * 2;
        if (uVar32 < (uint)__s[lVar29 + 4]) {
          __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3d5b,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        lVar8 = lVar8 + 1;
        uVar32 = __s[lVar29 + 4];
      } while (uVar23 - 1 != lVar8);
    }
    uVar22 = (ulong)maxSymbolValue;
    lVar8 = (uVar22 << 0x20) + 0x100000000;
    lVar29 = 0;
    do {
      lVar31 = lVar29 * 2;
      lVar29 = lVar29 + -1;
      lVar8 = lVar8 + -0x100000000;
    } while (__s[uVar22 * 2 + lVar31 + 2] == 0);
    uVar33 = uVar22 + lVar29 + 1;
    uVar9 = uVar22 + lVar29 + 0x100;
    __s[0x202] = __s[uVar22 * 2 + lVar31 + 2] + __s[uVar22 * 2 + lVar29 * 2 + 2];
    *(undefined2 *)(__s + uVar22 * 2 + lVar29 * 2 + 3) = 0x100;
    *(undefined2 *)(__s + uVar22 * 2 + lVar29 * 2 + 5) = 0x100;
    auVar6 = _DAT_001e3030;
    auVar5 = _DAT_001e3020;
    auVar4 = _DAT_001e2fc0;
    iVar19 = (int)uVar9;
    if ((long)uVar33 < 2) {
      *__s = 0x80000000;
      *(undefined1 *)((long)__s + (long)iVar19 * 8 + 0xf) = 0;
    }
    else {
      uVar36 = (ulong)(maxSymbolValue - 1) + lVar29;
      uVar24 = 0x101;
      if (0x101 < iVar19) {
        uVar24 = uVar9 & 0xffffffff;
      }
      local_68 = uVar22 + 0xff + lVar29;
      lVar31 = uVar24 - 0x101;
      auVar37._8_4_ = (int)lVar31;
      auVar37._0_8_ = lVar31;
      auVar37._12_4_ = (int)((ulong)lVar31 >> 0x20);
      uVar30 = 0;
      auVar37 = auVar37 ^ _DAT_001e3030;
      do {
        auVar38._8_4_ = (int)uVar30;
        auVar38._0_8_ = uVar30;
        auVar38._12_4_ = (int)(uVar30 >> 0x20);
        auVar39 = (auVar38 | auVar4) ^ auVar6;
        iVar28 = auVar37._4_4_;
        if ((bool)(~(auVar39._4_4_ == iVar28 && auVar37._0_4_ < auVar39._0_4_ ||
                    iVar28 < auVar39._4_4_) & 1)) {
          __s[uVar30 * 2 + 0x204] = 0x40000000;
        }
        if ((auVar39._12_4_ != auVar37._12_4_ || auVar39._8_4_ <= auVar37._8_4_) &&
            auVar39._12_4_ <= auVar37._12_4_) {
          __s[uVar30 * 2 + 0x206] = 0x40000000;
        }
        auVar38 = (auVar38 | auVar5) ^ auVar6;
        iVar13 = auVar38._4_4_;
        if (iVar13 <= iVar28 && (iVar13 != iVar28 || auVar38._0_4_ <= auVar37._0_4_)) {
          __s[uVar30 * 2 + 0x208] = 0x40000000;
          __s[uVar30 * 2 + 0x20a] = 0x40000000;
        }
        uVar30 = uVar30 + 4;
      } while ((uVar24 - 0xfd & 0xfffffffffffffffc) != uVar30);
      local_60 = uVar22;
      uVar24 = 0x101;
      if (0x101 < iVar19) {
        uVar24 = uVar9 & 0xffffffff;
      }
      *__s = 0x80000000;
      iVar28 = 0x100;
      lVar31 = 0;
      do {
        iVar35 = (int)uVar36;
        uVar32 = __s[(long)iVar35 * 2 + 2];
        uVar26 = __s[(long)iVar28 * 2 + 2];
        iVar13 = (iVar28 + 1) - (uint)(uVar32 < uVar26);
        iVar20 = iVar28;
        if (uVar32 < uVar26) {
          iVar20 = iVar35;
        }
        uVar15 = (uint)(uVar32 < uVar26);
        iVar27 = iVar35 - uVar15;
        uVar32 = __s[(long)iVar27 * 2 + 2];
        uVar26 = __s[(long)iVar13 * 2 + 2];
        iVar28 = (iVar13 + 1) - (uint)(uVar32 < uVar26);
        uVar36 = (ulong)((iVar35 - uVar15) - (uint)(uVar32 < uVar26));
        if (uVar32 < uVar26) {
          iVar13 = iVar27;
        }
        __s[lVar31 * 2 + 0x204] = __s[(long)iVar13 * 2 + 2] + __s[(long)iVar20 * 2 + 2];
        sVar11 = (short)lVar31 + 0x101;
        *(short *)(__s + (long)iVar13 * 2 + 3) = sVar11;
        *(short *)(__s + (long)iVar20 * 2 + 3) = sVar11;
        lVar31 = lVar31 + 1;
      } while (uVar24 - 0x100 != lVar31);
      *(undefined1 *)((long)__s + (long)iVar19 * 8 + 0xf) = 0;
      pcVar17 = (char *)((long)__s + (local_68 & 0xffffffff) * 8 + 0xf);
      do {
        *pcVar17 = *(char *)((long)__s + (ulong)*(ushort *)(pcVar17 + -3) * 8 + 0xf) + '\x01';
        uVar32 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar32;
        pcVar17 = pcVar17 + -8;
        pHVar21 = local_b0;
      } while (0x100 < (int)uVar32);
    }
    uVar22 = uVar22 + lVar29 + 2;
    if (-1 < (long)uVar33) {
      uVar9 = 0;
      do {
        *(char *)((long)__s + uVar9 * 8 + 0xf) =
             *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar9 * 2 + 3) * 8 + 0xf) + '\x01';
        uVar9 = uVar9 + 1;
      } while ((uVar22 & 0xffffffff) != uVar9);
    }
    bVar2 = *(byte *)((long)__s + (uVar33 & 0xffffffff) * 8 + 0xf);
    uVar32 = (uint)bVar2;
    if (uVar7 <= uVar32 && uVar32 - uVar7 != 0) {
      bVar10 = (byte)(uVar32 - uVar7);
      iVar19 = 1 << (bVar10 & 0x1f);
      bVar3 = *(byte *)((long)__s + (lVar8 >> 0x1d) + 0xf);
      uVar32 = (uint)bVar3;
      if (uVar7 < bVar3) {
        iVar28 = (int)lVar29 + maxSymbolValue + 1;
        puVar25 = (undefined1 *)((long)__s + (long)iVar28 * 8 + 0xf);
        lVar8 = (long)iVar28 << 0x20;
        uVar26 = 0;
        do {
          uVar26 = uVar26 + iVar19 + (-1 << (bVar2 - (char)uVar32 & 0x1f));
          *puVar25 = (char)uVar7;
          uVar32 = (uint)(byte)puVar25[-8];
          puVar25 = puVar25 + -8;
          lVar8 = lVar8 + -0x100000000;
          iVar28 = iVar28 + -1;
        } while (uVar7 < uVar32);
      }
      else {
        uVar26 = 0;
        iVar28 = (int)uVar33;
      }
      uVar32 = iVar28 + 1;
      lVar8 = (lVar8 >> 0x20) + 1;
      do {
        lVar29 = lVar8 * 8;
        uVar32 = uVar32 - 1;
        lVar8 = lVar8 + -1;
      } while (uVar7 == *(byte *)((long)__s + lVar29 + 7));
      if ((uVar26 & iVar19 - 1U) != 0) {
        __assert_fail("((U32)totalCost & (baseCost - 1)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c58,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      uVar26 = (int)uVar26 >> (bVar10 & 0x1f);
      if ((int)uVar26 < 1) {
        __assert_fail("totalCost > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c5a,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      local_78 = 0xf0f0f0f0f0f0f0f0;
      local_88 = 0xf0f0f0f0f0f0f0f0;
      uStack_80 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0;
      uStack_8e = 0xf0f0f0f0f0f0;
      local_a8[0] = 0xf0f0f0f0;
      local_a8[1] = 0xf0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      if (-1 < lVar8) {
        uVar9 = (ulong)uVar32;
        pbVar18 = (byte *)((long)__s + uVar9 * 8 + 0xf);
        uVar32 = uVar7;
        do {
          uVar15 = (uint)uVar9;
          if (*pbVar18 < uVar32) {
            uVar32 = (uint)*pbVar18;
            local_a8[uVar7 - uVar32] = uVar15;
          }
          uVar9 = uVar9 - 1;
          pbVar18 = pbVar18 + -8;
        } while (0 < (int)uVar15);
      }
      do {
        uVar32 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> uVar32 == 0; uVar32 = uVar32 - 1) {
          }
        }
        uVar9 = 1;
        if ((uVar32 ^ 0x1f) != 0x1f) {
          uVar24 = (ulong)(0x20 - (uVar32 ^ 0x1f));
          do {
            uVar36 = uVar24 - 1;
            if (((ulong)local_a8[uVar24] != 0xf0f0f0f0) &&
               ((local_a8[uVar36 & 0xffffffff] == 0xf0f0f0f0 ||
                ((uint)__s[(ulong)local_a8[uVar24] * 2 + 2] <=
                 (uint)(__s[(ulong)local_a8[uVar36 & 0xffffffff] * 2 + 2] * 2))))) {
              uVar9 = uVar24 & 0xffffffff;
              uVar32 = local_a8[uVar9];
              if (uVar32 == 0xf0f0f0f0) {
                __assert_fail("rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3c7c,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
              }
              if (0xc < uVar24) goto LAB_0014127b;
              break;
            }
            uVar24 = uVar36;
          } while ((uVar36 & 0xfffffffe) != 0);
        }
        do {
          if (local_a8[uVar9] != 0xf0f0f0f0) {
            uVar9 = uVar9 & 0xffffffff;
            goto LAB_00141268;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0xd);
        uVar9 = 0xd;
LAB_00141268:
        uVar32 = local_a8[uVar9];
        uVar24 = uVar9;
        if (uVar32 == 0xf0f0f0f0) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3c80,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
LAB_0014127b:
        uVar14 = (int)uVar24 - 1;
        pcVar17 = (char *)((long)__s + (ulong)uVar32 * 8 + 0xf);
        *pcVar17 = *pcVar17 + '\x01';
        uVar15 = local_a8[uVar14];
        if (local_a8[uVar14] == 0xf0f0f0f0) {
          uVar15 = uVar32;
        }
        local_a8[uVar14] = uVar15;
        if (local_a8[uVar9] == 0) {
          uVar32 = 0xf0f0f0f0;
        }
        else {
          uVar15 = local_a8[uVar9] - 1;
          uVar32 = 0xf0f0f0f0;
          if (uVar7 - (int)uVar24 == (uint)*(byte *)((long)__s + (ulong)uVar15 * 8 + 0xf)) {
            uVar32 = uVar15;
          }
        }
        uVar26 = uVar26 + (-1 << ((byte)uVar14 & 0x1f));
        local_a8[uVar9] = uVar32;
      } while (0 < (int)uVar26);
      pHVar21 = local_b0;
      uVar32 = uVar7;
      uVar15 = local_a8[1];
      if ((int)uVar26 < 0) {
        do {
          uVar14 = uVar15 + 0xf0f0f10;
          uVar16 = 0;
          while (uVar15 = uVar15 + 1, uVar14 != uVar16) {
            pcVar17 = (char *)((long)__s + (ulong)uVar15 * 8 + 0xf);
            *pcVar17 = *pcVar17 + -1;
            uVar16 = uVar16 - 1;
            if (uVar26 == uVar16) goto LAB_001412e2;
          }
          iVar19 = (int)lVar8;
          iVar28 = uVar26 - uVar16;
          lVar8 = (long)iVar19 + 1;
          uVar15 = iVar19 + 2;
          do {
            lVar29 = lVar8 * 8;
            lVar8 = lVar8 + -1;
            uVar15 = uVar15 - 1;
          } while (uVar7 == *(byte *)((long)__s + lVar29 + 7));
          pcVar17 = (char *)((long)__s + (long)(int)uVar15 * 8 + 0xf);
          *pcVar17 = *pcVar17 + -1;
          if (lVar8 < 0) {
            __assert_fail("n >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3ca8,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
          }
          uVar26 = iVar28 + 1;
        } while (iVar28 < -1);
      }
    }
LAB_001412e2:
    sVar34 = 0xffffffffffffffff;
    if (uVar32 < 0xd) {
      local_98 = 0;
      uStack_90 = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      uStack_a0 = 0;
      uStack_9e = 0;
      Stack_48 = SUB1610((undefined1  [16])0x0,6);
      Stack_58 = SUB1610((undefined1  [16])0x0,0);
      local_4e = 0;
      if (-1 < (long)uVar33) {
        uVar9 = 0;
        do {
          psVar1 = (short *)((long)local_a8 + (ulong)*(byte *)((long)__s + uVar9 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar9 = uVar9 + 1;
        } while ((uVar22 & 0xffffffff) != uVar9);
      }
      sVar34 = (size_t)uVar32;
      if (uVar32 != 0) {
        uVar22 = sVar34 + 1;
        uVar12 = 0;
        do {
          *(ushort *)((long)&local_60 + uVar22 * 2 + 6) = uVar12;
          uVar12 = (ushort)(uVar12 + *(short *)((long)&local_b0 + uVar22 * 2 + 6)) >> 1;
          uVar22 = uVar22 - 1;
        } while (1 < uVar22);
      }
      elt = pHVar21 + 1;
      uVar22 = 0;
      do {
        uVar9 = (ulong)*(byte *)((long)__s + uVar22 * 8 + 0xf);
        if (0xc < uVar9) {
          __assert_fail("nbBits <= HUF_TABLELOG_ABSOLUTEMAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3bae,"void HUF_setNbBits(HUF_CElt *, size_t)");
        }
        elt[*(byte *)((long)__s + uVar22 * 8 + 0xe)] = uVar9;
        uVar22 = uVar22 + 1;
      } while (uVar23 != uVar22);
      do {
        uVar12 = *(ushort *)((long)&Stack_58 + (ulong)(byte)*elt * 2);
        *(ushort *)((long)&Stack_58 + (ulong)(byte)*elt * 2) = uVar12 + 1;
        HUF_setValue(elt,(ulong)uVar12);
        elt = elt + 1;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      *pHVar21 = sVar34;
    }
  }
  return sVar34;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}